

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

ggml_tensor * __thiscall callback_data::filter_nonzero_rows(callback_data *this,ggml_tensor *a)

{
  int iVar1;
  bool bVar2;
  ggml_tensor *pgVar3;
  size_t __size;
  void *pvVar4;
  int i;
  int iVar5;
  int iVar6;
  ulong uVar7;
  anon_class_1_0_00000001 is_row_all_zeros;
  vector<int,_std::allocator<int>_> rows_to_copy;
  anon_class_1_0_00000001 local_55;
  int local_54;
  ulong local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_54 = 0; (long)local_54 < a->ne[1]; local_54 = local_54 + 1) {
    bVar2 = filter_nonzero_rows::anon_class_1_0_00000001::operator()(&local_55,a,local_54,1e-06);
    if (!bVar2) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_54);
    }
  }
  local_50 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2;
  if (0 < (int)(uint)local_50) {
    iVar6 = (int)a->ne[0];
    pgVar3 = (ggml_tensor *)
             ggml_new_tensor_2d(this->ctx_ggml,0,(long)iVar6,(uint)local_50 & 0x7fffffff);
    ggml_format_name(pgVar3,"diff_filtered_%s",a->name);
    __size = ggml_nbytes(pgVar3);
    pvVar4 = malloc(__size);
    pgVar3->data = pvVar4;
    uVar7 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    local_50 = (ulong)((uint)local_50 & 0x7fffffff);
    for (; uVar7 != local_50; uVar7 = uVar7 + 1) {
      iVar1 = local_48._M_impl.super__Vector_impl_data._M_start[uVar7];
      for (iVar5 = 0; iVar6 != iVar5; iVar5 = iVar5 + 1) {
        ggml_get_f32_nd(a,iVar5,iVar1,0,0);
        ggml_set_f32_nd(pgVar3,iVar5,uVar7 & 0xffffffff);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    return pgVar3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
             ,0x8a,"GGML_ASSERT(%s) failed","n_nonzero_rows > 0");
}

Assistant:

struct ggml_tensor * filter_nonzero_rows(struct ggml_tensor * a) {
        //printf("filter_nonzero_rows\n");
        auto is_row_all_zeros = [](struct ggml_tensor * t, int row, float eps) -> bool {
            // check if given row containing all zero elements
            int n_cols = t->ne[0]; // hint: should be equal to n_embd
            for (int col = 0; col < n_cols; ++col) {
                if (ggml_get_f32_nd(t, col, row, 0, 0) > eps) {
                    return false;
                }
            }
            return true;
        };
        std::vector<int> rows_to_copy; // the idx of non-zero cols (to be copied to row of diff_filtered)
        for (int i_row = 0; i_row < a->ne[1]; i_row++) {
            if (!is_row_all_zeros(a, i_row, 1e-6)) {
                rows_to_copy.push_back(i_row);
            }
        }

        // get "n_nonzero_rows" for the output "diff_filtered"
        int n_nonzero_rows = rows_to_copy.size();
        //printf("n_nonzero_rows: %d\n", n_nonzero_rows);
        int n_embd = a->ne[0];
        GGML_ASSERT(n_nonzero_rows > 0);

        // diff_filtered: [n_embd, n_nonzero_rows]
        struct ggml_tensor * diff_filtered = ggml_new_tensor_2d(
            ctx_ggml, GGML_TYPE_F32, n_embd, n_nonzero_rows);
        ggml_format_name(diff_filtered, "diff_filtered_%s", a->name);
        diff_filtered->data = malloc(ggml_nbytes(diff_filtered));

        // copy non-zero rows
        for (int dest_row = 0; dest_row < n_nonzero_rows; dest_row++) {
            int src_row = rows_to_copy[dest_row];
            for (int i = 0; i < n_embd; i++) {
                float src_elem = ggml_get_f32_nd(a, i, src_row, 0, 0);
                ggml_set_f32_nd(diff_filtered, i, dest_row, 0, 0, src_elem);
            }
        }

        //print_debug_tensor(diff_filtered);

        return diff_filtered;
    }